

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batcher.c
# Opt level: O2

size_t duckdb_je_batcher_pop_begin(tsdn_t *tsdn,batcher_t *batcher)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = 0xffffffffffffffff;
  if ((batcher->nelems).repr != 0) {
    malloc_mutex_lock(tsdn,&batcher->mtx);
    sVar1 = (batcher->nelems).repr;
    if (sVar1 == 0) {
      (batcher->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(batcher->mtx).field_0 + 0x48));
    }
    else {
      (batcher->nelems).repr = 0;
      sVar2 = sVar1;
    }
  }
  return sVar2;
}

Assistant:

size_t
batcher_pop_begin(tsdn_t *tsdn, batcher_t *batcher) {
	size_t nelems_guess = atomic_load_zu(&batcher->nelems, ATOMIC_RELAXED);
	assert(nelems_guess <= batcher->nelems_max);
	if (nelems_guess == 0) {
		return BATCHER_NO_IDX;
	}
	malloc_mutex_lock(tsdn, &batcher->mtx);
	size_t nelems = atomic_load_zu(&batcher->nelems, ATOMIC_RELAXED);
	assert(nelems <= batcher->nelems_max);
	if (nelems == 0) {
		malloc_mutex_unlock(tsdn, &batcher->mtx);
		return BATCHER_NO_IDX;
	}
	atomic_store_zu(&batcher->nelems, 0, ATOMIC_RELAXED);
	return nelems;
}